

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

LayerNormalizationLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_layernormalization(NeuralNetworkLayer *this)

{
  bool bVar1;
  LayerNormalizationLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_layernormalization(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_layernormalization(this);
    this_00 = (LayerNormalizationLayerParams *)operator_new(0x40);
    LayerNormalizationLayerParams::LayerNormalizationLayerParams(this_00);
    (this->layer_).layernormalization_ = this_00;
  }
  return (LayerNormalizationLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::LayerNormalizationLayerParams* NeuralNetworkLayer::mutable_layernormalization() {
  if (!has_layernormalization()) {
    clear_layer();
    set_has_layernormalization();
    layer_.layernormalization_ = new ::CoreML::Specification::LayerNormalizationLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.layerNormalization)
  return layer_.layernormalization_;
}